

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

void __thiscall PythonModuleClient::recv_time(PythonModuleClient *this,uint32_t time)

{
  bool_type bVar1;
  uint32_t in_ESI;
  AbstractModuleClient *in_RDI;
  error_already_set *anon_var_0;
  override recv_time;
  PyLockGIL lock;
  object_operators<boost::python::api::object> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffd0;
  wrapper<AbstractModuleClient> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  AbstractModuleClient *this_00;
  
  this_00 = in_RDI;
  PyLockGIL::PyLockGIL((PyLockGIL *)in_stack_ffffffffffffffb0);
  boost::python::wrapper<AbstractModuleClient>::get_override
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = boost::python::api::object_operators::operator_cast_to_function_pointer
                    (in_stack_ffffffffffffffb0);
  if (bVar1 != 0) {
    boost::python::override::operator()
              ((override *)this_00,(uint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    boost::python::detail::method_result::~method_result((method_result *)0x3e64b0);
  }
  boost::python::override::~override((override *)0x3e655e);
  if (bVar1 == 0) {
    AbstractModuleClient::recv_time(in_RDI,in_ESI);
  }
  PyLockGIL::~PyLockGIL((PyLockGIL *)0x3e6588);
  return;
}

Assistant:

void recv_time(uint32_t time){
        PyLockGIL lock;
        if(override recv_time = this->get_override("recv_time")){
            try{
                recv_time(time);
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_time in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_time(time);
    }